

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.cpp
# Opt level: O1

void __thiscall Js::Utf8SourceInfo::SetFunctionBody(Utf8SourceInfo *this,FunctionBody *functionBody)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  FunctionBody *pFVar3;
  bool bVar4;
  uint uVar5;
  ScriptContext *pSVar6;
  undefined4 *puVar7;
  FunctionBody *local_38;
  FunctionBody *oldFunctionBody;
  FunctionBody *pFStack_28;
  LocalFunctionId functionId;
  FunctionBody *functionBody_local;
  
  pSVar1 = (this->m_scriptContext).ptr;
  pFStack_28 = functionBody;
  pSVar6 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  if (pSVar1 != pSVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Utf8SourceInfo.cpp"
                                ,0x7d,"(this->m_scriptContext == functionBody->GetScriptContext())",
                                "this->m_scriptContext == functionBody->GetScriptContext()");
    if (!bVar4) goto LAB_007d6314;
    *puVar7 = 0;
  }
  if ((this->functionBodyDictionary).ptr ==
      (SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
       *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Utf8SourceInfo.cpp"
                                ,0x7e,"(this->functionBodyDictionary)",
                                "this->functionBodyDictionary");
    if (!bVar4) goto LAB_007d6314;
    *puVar7 = 0;
  }
  uVar5 = ParseableFunctionInfo::GetSourceIndex(&pFStack_28->super_ParseableFunctionInfo);
  if (uVar5 == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Utf8SourceInfo.cpp"
                                ,0x81,
                                "(functionBody->GetSourceIndex() != Js::Constants::InvalidSourceIndex)"
                                ,
                                "functionBody->GetSourceIndex() != Js::Constants::InvalidSourceIndex"
                               );
    if (!bVar4) goto LAB_007d6314;
    *puVar7 = 0;
  }
  if ((pFStack_28->field_0x178 & 8) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Utf8SourceInfo.cpp"
                                ,0x82,"(!functionBody->GetIsFuncRegistered())",
                                "!functionBody->GetIsFuncRegistered()");
    if (!bVar4) goto LAB_007d6314;
    *puVar7 = 0;
  }
  pFVar3 = pFStack_28;
  if ((pFStack_28->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) goto LAB_007d6314;
    *puVar7 = 0;
  }
  oldFunctionBody._4_4_ =
       ((pFVar3->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr)->functionId;
  local_38 = (FunctionBody *)0x0;
  bVar4 = JsUtil::
          BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetValue<unsigned_int>
                    (&((this->functionBodyDictionary).ptr)->
                      super_BaseDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     ,(uint *)((long)&oldFunctionBody + 4),&local_38);
  if (bVar4) {
    if (local_38 == pFStack_28) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Utf8SourceInfo.cpp"
                                  ,0x87,"(oldFunctionBody != functionBody)",
                                  "oldFunctionBody != functionBody");
      if (!bVar4) {
LAB_007d6314:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    *(uint *)&local_38->field_0x178 = *(uint *)&local_38->field_0x178 & 0xfffffff7;
  }
  JsUtil::
  SynchronizedDictionary<unsigned_int,_Js::FunctionBody_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
  ::Item((this->functionBodyDictionary).ptr,(uint *)((long)&oldFunctionBody + 4),
         &stack0xffffffffffffffd8);
  *(uint *)&pFStack_28->field_0x178 = *(uint *)&pFStack_28->field_0x178 | 8;
  return;
}

Assistant:

void Utf8SourceInfo::SetFunctionBody(FunctionBody * functionBody)
    {
        Assert(this->m_scriptContext == functionBody->GetScriptContext());
        Assert(this->functionBodyDictionary);

        // Only register a function body when source info is ready. Note that m_pUtf8Source can still be null for lib script.
        Assert(functionBody->GetSourceIndex() != Js::Constants::InvalidSourceIndex);
        Assert(!functionBody->GetIsFuncRegistered());

        const LocalFunctionId functionId = functionBody->GetLocalFunctionId();
        FunctionBody* oldFunctionBody = nullptr;
        if (functionBodyDictionary->TryGetValue(functionId, &oldFunctionBody)) {
            Assert(oldFunctionBody != functionBody);
            oldFunctionBody->SetIsFuncRegistered(false);
        }

        functionBodyDictionary->Item(functionId, functionBody);
        functionBody->SetIsFuncRegistered(true);
    }